

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t checksum(archive_read *a,void *h)

{
  byte bVar1;
  long lVar2;
  int64_t iVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  lVar2 = 0;
  while (((bVar1 = *(byte *)((long)a->bidders + lVar2 + -100), bVar1 - 0x30 < 8 || (bVar1 == 0x20))
         || (bVar1 == 0))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 8) {
      iVar3 = tar_atol((char *)((long)&a->entry + 4),8);
      lVar2 = 0;
      iVar5 = 0;
      do {
        iVar7 = iVar5;
        uVar6 = (uint)*(byte *)((long)&(a->archive).magic + lVar2);
        lVar2 = lVar2 + 1;
        iVar5 = iVar7 + uVar6;
      } while (lVar2 != 0x94);
      iVar5 = iVar7 + uVar6 + 0x100;
      lVar2 = 0x9c;
      do {
        iVar5 = iVar5 + (uint)*(byte *)((long)&(a->archive).magic + lVar2);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x200);
      wVar4 = L'\x01';
      if (iVar5 != (int)iVar3) {
        lVar2 = 0;
        iVar5 = 0;
        do {
          iVar8 = iVar5;
          iVar7 = (int)*(char *)((long)&(a->archive).magic + lVar2);
          lVar2 = lVar2 + 1;
          iVar5 = iVar8 + iVar7;
        } while (lVar2 != 0x94);
        iVar5 = iVar8 + iVar7 + 0x100;
        lVar2 = 0x9c;
        do {
          iVar5 = iVar5 + *(char *)((long)&(a->archive).magic + lVar2);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x200);
        wVar4 = (wchar_t)(iVar5 == (int)iVar3);
      }
      return wVar4;
    }
  }
  return L'\0';
}

Assistant:

static int
checksum(struct archive_read *a, const void *h)
{
	const unsigned char *bytes;
	const struct archive_entry_header_ustar	*header;
	int check, sum;
	size_t i;

	(void)a; /* UNUSED */
	bytes = (const unsigned char *)h;
	header = (const struct archive_entry_header_ustar *)h;

	/* Checksum field must hold an octal number */
	for (i = 0; i < sizeof(header->checksum); ++i) {
		char c = header->checksum[i];
		if (c != ' ' && c != '\0' && (c < '0' || c > '7'))
			return 0;
	}

	/*
	 * Test the checksum.  Note that POSIX specifies _unsigned_
	 * bytes for this calculation.
	 */
	sum = (int)tar_atol(header->checksum, sizeof(header->checksum));
	check = 0;
	for (i = 0; i < 148; i++)
		check += (unsigned char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (unsigned char)bytes[i];
	if (sum == check)
		return (1);

	/*
	 * Repeat test with _signed_ bytes, just in case this archive
	 * was created by an old BSD, Solaris, or HP-UX tar with a
	 * broken checksum calculation.
	 */
	check = 0;
	for (i = 0; i < 148; i++)
		check += (signed char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (signed char)bytes[i];
	if (sum == check)
		return (1);

	return (0);
}